

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

int __thiscall
ON_NurbsSurface::CreateRuledSurface
          (ON_NurbsSurface *this,ON_Curve *curveA,ON_Curve *curveB,ON_Interval *curveA_domain,
          ON_Interval *curveB_domain)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  ON_NurbsCurve *pOVar7;
  int i;
  ON_NurbsCurve nurbs_curveA;
  ON_NurbsCurve nurbs_curveB;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  ON_NurbsCurve::ON_NurbsCurve(&nurbs_curveA);
  ON_NurbsCurve::ON_NurbsCurve(&nurbs_curveB);
  if ((this->m_cv != (double *)0x0) && (this->m_cv_capacity == 0)) {
    nurbs_curveA.m_cv = this->m_cv;
  }
  if ((this->m_knot[0] != (double *)0x0) && (this->m_knot_capacity[0] == 0)) {
    nurbs_curveA.m_knot = this->m_knot[0];
  }
  iVar2 = (*(curveA->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3f])
                    (0,curveA,&nurbs_curveA,curveA_domain);
  iVar5 = 0;
  iVar4 = 0;
  if ((((iVar2 < 1) ||
       (iVar3 = (*(curveB->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3f])
                          (0,curveB,&nurbs_curveB,curveB_domain), iVar3 < 1)) ||
      (bVar1 = ON_Internal_MakeKnotVectorsCompatible(&nurbs_curveA,&nurbs_curveB), iVar4 = iVar5,
      !bVar1)) ||
     ((nurbs_curveA.m_cv_count != nurbs_curveB.m_cv_count ||
      (nurbs_curveA.m_order != nurbs_curveB.m_order)))) goto LAB_0055a20a;
  iVar4 = ON_NurbsCurve::Dimension(&nurbs_curveA);
  if (iVar4 < 4) {
    iVar4 = 3;
  }
  else {
    iVar4 = ON_NurbsCurve::Dimension(&nurbs_curveA);
  }
  iVar5 = ON_NurbsCurve::Dimension(&nurbs_curveB);
  if (iVar4 < iVar5) {
    iVar4 = ON_NurbsCurve::Dimension(&nurbs_curveB);
  }
  pOVar7 = &nurbs_curveA;
  iVar5 = ON_NurbsCurve::Dimension(pOVar7);
  if (iVar5 < iVar4) {
LAB_0055a0b5:
    ON_NurbsCurve::ChangeDimension(pOVar7,iVar4);
  }
  else {
    pOVar7 = &nurbs_curveB;
    iVar5 = ON_NurbsCurve::Dimension(pOVar7);
    if (iVar5 < iVar4) goto LAB_0055a0b5;
  }
  bVar1 = ON_NurbsCurve::IsRational(&nurbs_curveA);
  pOVar7 = &nurbs_curveB;
  if ((bVar1) || (bVar1 = ON_NurbsCurve::IsRational(&nurbs_curveB), pOVar7 = &nurbs_curveA, bVar1))
  {
    ON_NurbsCurve::MakeRational(pOVar7);
  }
  bVar1 = nurbs_curveA.m_is_rat != 0;
  if (bVar1) {
    nurbs_curveA.m_is_rat = 0;
    nurbs_curveA.m_dim = nurbs_curveA.m_dim + 1;
  }
  ON_NurbsCurve::ChangeDimension(&nurbs_curveA,nurbs_curveA.m_dim * 2);
  nurbs_curveA.m_is_rat = (int)bVar1;
  nurbs_curveA.m_dim = iVar4;
  if ((this->m_cv != (double *)0x0) && (0 < this->m_cv_capacity)) {
    onfree(this->m_cv);
  }
  this->m_cv = nurbs_curveA.m_cv;
  this->m_cv_capacity = nurbs_curveA.m_cv_capacity;
  nurbs_curveA.m_cv_capacity = 0;
  if ((this->m_knot[0] != (double *)0x0) && (0 < this->m_knot_capacity[0])) {
    onfree(this->m_knot[0]);
  }
  ON_NurbsCurve::UnmanageKnotForExperts(&nurbs_curveA,this->m_knot_capacity,this->m_knot);
  ReserveKnotCapacity(this,1,2);
  pdVar6 = this->m_knot[1];
  *(undefined4 *)pdVar6 = 0;
  *(undefined4 *)((long)pdVar6 + 4) = 0;
  *(undefined4 *)(pdVar6 + 1) = 0;
  *(undefined4 *)((long)pdVar6 + 0xc) = 0x3ff00000;
  this->m_dim = iVar4;
  this->m_is_rat = nurbs_curveA.m_is_rat;
  this->m_order[0] = nurbs_curveA.m_order;
  this->m_order[1] = 2;
  this->m_cv_count[0] = nurbs_curveA.m_cv_count;
  this->m_cv_count[1] = 2;
  this->m_cv_stride[0] = nurbs_curveA.m_cv_stride;
  this->m_cv_stride[1] = nurbs_curveA.m_cv_stride / 2;
  for (iVar4 = 0; iVar4 < nurbs_curveA.m_cv_count; iVar4 = iVar4 + 1) {
    pdVar6 = ON_NurbsCurve::CV(&nurbs_curveB,iVar4);
    SetCV(this,iVar4,1,intrinsic_point_style,pdVar6);
    nurbs_curveA.m_cv_count = this->m_cv_count[0];
  }
  iVar4 = iVar3;
  if (iVar3 < iVar2) {
    iVar4 = iVar2;
  }
LAB_0055a20a:
  ON_NurbsCurve::~ON_NurbsCurve(&nurbs_curveB);
  ON_NurbsCurve::~ON_NurbsCurve(&nurbs_curveA);
  return iVar4;
}

Assistant:

int ON_NurbsSurface::CreateRuledSurface(
       const ON_Curve& curveA,
       const ON_Curve& curveB,
       const ON_Interval* curveA_domain,
       const ON_Interval* curveB_domain
       )
{
  DestroySurfaceTree();
  int rcA=1, rcB=1;
  ON_NurbsCurve nurbs_curveA, nurbs_curveB;
  if ( m_cv && m_cv_capacity == 0 )
    nurbs_curveA.m_cv = m_cv;
  if ( m_knot[0] && m_knot_capacity[0] == 0 )
    nurbs_curveA.m_knot = m_knot[0];
  rcA = curveA.GetNurbForm( nurbs_curveA, 0.0, curveA_domain );
  if ( rcA<=0 )
    return 0;
  rcB = curveB.GetNurbForm( nurbs_curveB, 0.0, curveB_domain );
  if ( rcB<=0 )
    return 0;

  if ( !ON_Internal_MakeKnotVectorsCompatible( nurbs_curveA, nurbs_curveB ) )
    return false;

  if ( nurbs_curveA.m_cv_count != nurbs_curveB.m_cv_count )
    return 0;
  if ( nurbs_curveA.m_order != nurbs_curveB.m_order )
    return 0;

  int srf_dim = 3;
  if ( nurbs_curveA.Dimension() > srf_dim )
    srf_dim = nurbs_curveA.Dimension();
  if ( nurbs_curveB.Dimension() > srf_dim )
    srf_dim = nurbs_curveB.Dimension();

  if (nurbs_curveA.Dimension() < srf_dim )
    nurbs_curveA.ChangeDimension(srf_dim);
  else if (nurbs_curveB.Dimension() < srf_dim )
    nurbs_curveB.ChangeDimension(srf_dim);

  if ( nurbs_curveA.IsRational() )
    nurbs_curveB.MakeRational();
  else if ( nurbs_curveB.IsRational() )
    nurbs_curveA.MakeRational();

  // reserve enough room in nurbs_curveA.m_cv 
  // for two rows of surface cvs.
  const int is_rat = nurbs_curveA.m_is_rat ? 1 : 0;
  if ( is_rat )
  {
    nurbs_curveA.m_is_rat = 0;
    nurbs_curveA.m_dim++;
  }
  nurbs_curveA.ChangeDimension( 2*nurbs_curveA.m_dim );
  nurbs_curveA.m_dim = srf_dim;
  nurbs_curveA.m_is_rat = is_rat;

  // transfer m_cv and m_knot[0] memory from nurbs_curveA to
  // this nurbs surface.
  if ( m_cv && m_cv_capacity > 0 )
    onfree(m_cv);
  m_cv = nurbs_curveA.m_cv;
  m_cv_capacity = nurbs_curveA.m_cv_capacity;
  nurbs_curveA.m_cv_capacity = 0;

  if ( m_knot[0] && m_knot_capacity[0] > 0 )
    onfree(m_knot[0]);

  // transfer knot vector from nurbs_curveA to srf.m_knot[0]
  nurbs_curveA.UnmanageKnotForExperts(m_knot_capacity[0], m_knot[0]);

  // Fill in linear knots
  ReserveKnotCapacity( 1, 2 );
  m_knot[1][0] = 0.0;
  m_knot[1][1] = 1.0;

  m_dim = srf_dim;
  m_is_rat = nurbs_curveA.m_is_rat;
  m_order[0] = nurbs_curveA.m_order;
  m_order[1] = 2;
  m_cv_count[0] = nurbs_curveA.m_cv_count;
  m_cv_count[1] = 2;
  m_cv_stride[0] = nurbs_curveA.m_cv_stride;
  m_cv_stride[1] = m_cv_stride[0]/2;

  // fill in "B" row of cvs
  for ( int i = 0; i < m_cv_count[0]; i++ )
  {
    SetCV(i,1,ON::intrinsic_point_style, nurbs_curveB.CV(i));
  }

  return ((rcA<=rcB) ? rcB : rcA);
}